

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_dateTime(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_220;
  Status myStatus_16;
  char iv_1 [20];
  char iv_2 [22];
  char iv_4 [23];
  char iv_3 [23];
  char iv_5 [26];
  char v_3 [26];
  char v_2 [26];
  char v_1 [32];
  char v_3_canrep [21];
  char v_2_canrep [21];
  char v_1_canrep [26];
  undefined8 uStack_a8;
  undefined8 uStack_80;
  undefined8 uStack_58;
  int iVar11;
  
  builtin_strncpy(v_1 + 0x10,":59:59.00389  \n",0x10);
  builtin_strncpy(v_1,"   2000-12-31T23",0x10);
  builtin_strncpy(v_2 + 0x10,":20+13:30",10);
  builtin_strncpy(v_2,"2000-10-01T11:10",0x10);
  builtin_strncpy(v_3 + 0x10,":20-06:00",10);
  builtin_strncpy(v_3,"2000-10-01T11:10",0x10);
  builtin_strncpy(iv_1,"0000-12-31T23:59:59",0x14);
  builtin_strncpy(iv_2 + 0x10,"9:59Z",6);
  builtin_strncpy(iv_2,"+2000-11-30T23:5",0x10);
  builtin_strncpy(iv_3,"2000-02-28T23:59.1:59Z",0x17);
  builtin_strncpy(iv_4,"2000-11-30T01:01:01Z99",0x17);
  builtin_strncpy(iv_5 + 0x10,":01Z10:61",10);
  builtin_strncpy(iv_5,"2000-02-28T01:01",0x10);
  builtin_strncpy(v_1_canrep + 0x10,":59.00389",10);
  builtin_strncpy(v_1_canrep,"2000-12-31T23:59",0x10);
  builtin_strncpy(v_2_canrep + 0x10,":20Z",5);
  builtin_strncpy(v_2_canrep,"2000-09-30T21:40",0x10);
  builtin_strncpy(v_3_canrep + 0x10,":20Z",5);
  builtin_strncpy(v_3_canrep,"2000-10-01T17:10",0x10);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1226,v_1,local_220.fLocalForm,1);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1227,v_2,local_220.fLocalForm,1);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1228,v_3,local_220.fLocalForm,1);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122b,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00125892;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122b,iv_1,local_220.fLocalForm,0);
LAB_00125892:
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122c,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_0012596a;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122c,iv_2,local_220.fLocalForm,0);
LAB_0012596a:
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122d,iv_3,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00125a42;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122d,iv_3,local_220.fLocalForm,0);
LAB_00125a42:
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_4);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    if (myStatus != st_FODT0003) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122e,iv_4,pcVar1,"st_FODT0003",pcVar6);
      goto LAB_00125b1a;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122e,iv_4,local_220.fLocalForm,0);
LAB_00125b1a:
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_5);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (cVar2 == '\0') {
    if (myStatus == st_FODT0003) goto LAB_00125c01;
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    pcVar1 = local_220.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x122f,iv_5,pcVar1,"st_FODT0003",pcVar6);
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122f,iv_5,local_220.fLocalForm,0);
  }
  StrX::~StrX(&local_220);
  errSeen = 1;
LAB_00125c01:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,v_1);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1249,v_1);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_double = 2.54639504797146e-313;
      expValue._0_8_ = uStack_58;
      expValue.fValue._8_8_ = 0x170000001f;
      expValue.fValue._16_8_ = 0x3b0000003b;
      expValue.fValue.f_datetime.f_milisec = 0.00389;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,v_2);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124a,v_2);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_double = 1.90979631068187e-313;
      expValue_00._0_8_ = uStack_80;
      expValue_00.fValue._8_8_ = 0x150000001e;
      expValue_00.fValue._16_8_ = 0x1400000028;
      expValue_00.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,v_3);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124b,v_3);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    else {
      expValue_01.fValue.f_double = 2.1219958897784e-313;
      expValue_01._0_8_ = uStack_a8;
      expValue_01.fValue._8_8_ = 0x1100000001;
      expValue_01.fValue._16_8_ = 0x140000000a;
      expValue_01.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar1 = local_220.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124e,iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_220);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x124e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124e,iv_1);
      StrX::~StrX(&local_220);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar1 = local_220.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124f,iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_220);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x124f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124f,iv_2);
      StrX::~StrX(&local_220);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,iv_3);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar1 = local_220.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1250,iv_3,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_220);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1250;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1250,iv_3);
      StrX::~StrX(&local_220);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,iv_4);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FODT0003) {
        StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar1 = local_220.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1251,iv_4,pcVar1,"st_FODT0003",pcVar6);
        StrX::~StrX(&local_220);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1251;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1251,iv_4);
      StrX::~StrX(&local_220);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_220,iv_5);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_220);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FODT0003) {
        StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar1 = local_220.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1252,iv_5,pcVar1,"st_FODT0003",pcVar6);
        StrX::~StrX(&local_220);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1252;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1252,iv_5);
      StrX::~StrX(&local_220);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
LAB_00126451:
  iVar10 = iVar11 + -1;
  if (iVar11 == 0) {
    return;
  }
  myStatus_16 = st_Init;
  StrX::StrX(&local_220,v_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_220.fUnicodeForm,dt_dateTime,&myStatus_16,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x126e,v_1);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_1_canrep);
    if (!bVar3) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x126e,v_1,local_220.fLocalForm,_myStatus,v_1_canrep);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_16 = st_Init;
  StrX::StrX(&local_220,v_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_220.fUnicodeForm,dt_dateTime,&myStatus_16,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x126f,v_2);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_2_canrep);
    if (!bVar3) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x126f,v_2,local_220.fLocalForm,_myStatus,v_2_canrep);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_16 = st_Init;
  StrX::StrX(&local_220,v_3);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_220.fUnicodeForm,dt_dateTime,&myStatus_16,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1270,v_3);
    StrX::~StrX(&local_220);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,v_3_canrep);
    if (!bVar3) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x1270,v_3,local_220.fLocalForm,_myStatus,v_3_canrep);
      StrX::~StrX(&local_220);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_1);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1273,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_220);
      goto LAB_0012688b;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1273,iv_1);
    StrX::~StrX(&local_220);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012688b:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_2);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1274,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_220);
      goto LAB_00126976;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1274,iv_2);
    StrX::~StrX(&local_220);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00126976:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_3);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1275,iv_3,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_220);
      goto LAB_00126a61;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1275,iv_3);
    StrX::~StrX(&local_220);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00126a61:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_4);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  if (lVar8 == 0) {
    if (myStatus != st_FODT0003) {
      StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pcVar1 = local_220.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1276,iv_4,pcVar1,"st_FODT0003",pcVar6);
      StrX::~StrX(&local_220);
      goto LAB_00126b4c;
    }
  }
  else {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1276,iv_4);
    StrX::~StrX(&local_220);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00126b4c:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_220,iv_5);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_220.fUnicodeForm,dt_dateTime,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_220);
  iVar11 = iVar10;
  if (lVar8 == 0) goto LAB_00126be3;
  StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x1277,iv_5);
  StrX::~StrX(&local_220);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
  goto LAB_00126c37;
LAB_00126be3:
  if (myStatus != st_FODT0003) {
    StrX::StrX(&local_220,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    pcVar1 = local_220.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1277,iv_5,pcVar1,"st_FODT0003",pcVar6);
    StrX::~StrX(&local_220);
LAB_00126c37:
    errSeen = 1;
  }
  goto LAB_00126451;
}

Assistant:

void test_dt_dateTime()
{
    const XSValue::DataType dt = XSValue::dt_dateTime;
    bool  toValidate = true;

    const char v_1[]="   2000-12-31T23:59:59.00389  \n";
    const char v_2[]="2000-10-01T11:10:20+13:30";
    const char v_3[]="2000-10-01T11:10:20-06:00";

    const char iv_1[]="0000-12-31T23:59:59";
    const char iv_2[]="+2000-11-30T23:59:59Z";
    const char iv_3[]="2000-02-28T23:59.1:59Z";
    const char iv_4[]="2000-11-30T01:01:01Z99";
    const char iv_5[]="2000-02-28T01:01:01Z10:61";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="2000-12-31T23:59:59.00389";
    const char v_2_canrep[]="2000-09-30T21:40:20Z";
    const char v_3_canrep[]="2000-10-01T17:10:20Z";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 59;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 59;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0.00389;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 9;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 21;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 40;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 17;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 10;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

 /***
 * E2-41
 *
 *  3.2.7.2 Canonical representation
 *
 *  Except for trailing fractional zero digits in the seconds representation,
 *  '24:00:00' time representations, and timezone (for timezoned values),
 *  the mapping from literals to values is one-to-one. Where there is more
 *  than one possible representation, the canonical representation is as follows:
 *  redundant trailing zero digits in fractional-second literals are prohibited.
 *  An hour representation of '24' is prohibited. Timezoned values are canonically
 *  represented by appending 'Z' to the nontimezoned representation. (All
 *  timezoned dateTime values are UTC.)
 *
 *  .'24:00:00' -> '00:00:00'
 *  .milisecond: trailing zeros removed
 *  .'Z'
 *
 ***/

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_4, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);
    VALIDATE_TEST(iv_5, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_4, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
        ACTVALUE_TEST(iv_5, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_4, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);
        CANREP_TEST(iv_5, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);

    }

}